

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O3

const_iterator __thiscall
frozen::
unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,97ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
::
find<std::__cxx11::string,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
          (unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,97ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *hash,
          equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *equal)

{
  size_t __n;
  int iVar1;
  size_t sVar2;
  
  sVar2 = bits::pmh_tables<128ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>
          ::
          lookup<std::__cxx11::string,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>
                    ((pmh_tables<128ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>
                      *)(this + 0x920),key,hash);
  __n = key->_M_string_length;
  if (*(size_t *)(this + sVar2 * 0x18 + 8) == __n) {
    if (__n == 0) {
      return (const_iterator)(this + sVar2 * 0x18 + 8);
    }
    iVar1 = bcmp(*(void **)(this + sVar2 * 0x18 + 0x10),(key->_M_dataplus)._M_p,__n);
    if (iVar1 == 0) {
      return (const_iterator)(this + sVar2 * 0x18 + 8);
    }
  }
  return (const_iterator)(this + 0x920);
}

Assistant:

constexpr const_iterator find(KeyType const &key, Hasher const &hash, Equal const &equal) const {
    return find_impl(*this, key, hash, equal);
  }